

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  anon_union_208_8_f709340f_for_proto *pp;
  CURLcode CVar1;
  HTTP *pHVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 connected;
  SessionHandle *data;
  pop3_conn *pop3c;
  SessionHandle *pSVar5;
  bool bVar6;
  
  *done = false;
  Curl_reset_reqproto(conn);
  pSVar5 = conn->data;
  pHVar2 = (pSVar5->state).proto.http;
  data = pSVar5;
  if (pHVar2 == (HTTP *)0x0) {
    pHVar2 = (HTTP *)(*Curl_ccalloc)(0x28,1);
    (pSVar5->state).proto.http = pHVar2;
    if (pHVar2 == (HTTP *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    data = conn->data;
  }
  pHVar2->sendit = (FormData *)&(pSVar5->req).bytecount;
  pcVar3 = conn->passwd;
  pHVar2->postsize = (curl_off_t)conn->user;
  pHVar2->postdata = pcVar3;
  CVar1 = Curl_urldecode(data,(data->state).path,0,&(conn->proto).ftpc.entrypath,(size_t *)0x0,true)
  ;
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
  pSVar5 = conn->data;
  pcVar3 = (pSVar5->set).str[4];
  if (pcVar3 != (char *)0x0) {
    CVar1 = Curl_urldecode(pSVar5,pcVar3,0,&(conn->proto).pop3c.custom,(size_t *)0x0,true);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pSVar5 = conn->data;
  }
  (pSVar5->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar5,0);
  Curl_pgrsSetDownloadCounter(pSVar5,0);
  Curl_pgrsSetUploadSize(pSVar5,0);
  Curl_pgrsSetDownloadSize(pSVar5,0);
  pSVar5 = conn->data;
  if ((pSVar5->set).opt_no_body == true) {
    ((pSVar5->state).proto.ftp)->transfer = FTPTRANSFER_INFO;
  }
  *done = false;
  pp = &conn->proto;
  pcVar3 = (conn->proto).ftpc.entrypath;
  if (*pcVar3 == '\0') {
LAB_00132b43:
    pcVar3 = (conn->proto).pop3c.custom;
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      pcVar3 = "LIST";
    }
    CVar1 = Curl_pp_sendf(&(pp->ftpc).pp,pcVar3);
  }
  else {
    if ((pSVar5->set).ftp_list_only == true) {
      ((pSVar5->state).proto.ftp)->transfer = FTPTRANSFER_INFO;
      if (*pcVar3 == '\0') goto LAB_00132b43;
      pcVar3 = "LIST";
    }
    else {
      pcVar3 = "RETR";
    }
    pcVar4 = (conn->proto).pop3c.custom;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      pcVar4 = pcVar3;
    }
    pcVar3 = "%s %s";
    CVar1 = Curl_pp_sendf(&(pp->ftpc).pp,"%s %s",pcVar4);
  }
  connected = SUB81(pcVar3,0);
  if (CVar1 == CURLE_OK) {
    (conn->proto).ftpc.count2 = 0x10;
    if ((conn->data->state).used_interface == Curl_if_multi) {
      CVar1 = Curl_pp_multi_statemach(&(pp->ftpc).pp);
      bVar6 = (conn->proto).ftpc.count2 == 0;
      *done = bVar6;
      if (CVar1 != CURLE_OK || !bVar6) {
        return CVar1;
      }
    }
    else {
      do {
        CVar1 = Curl_pp_easy_statemach(&(pp->ftpc).pp);
        connected = SUB81(pcVar3,0);
        if (CVar1 != CURLE_OK) {
          *done = true;
          return CVar1;
        }
      } while ((conn->proto).ftpc.count2 != 0);
      *done = true;
    }
    pop3_dophase_done(conn,(_Bool)connected);
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode retcode = CURLE_OK;

  *done = FALSE; /* default to false */

  /*
    Since connections can be re-used between SessionHandles, this might be a
    connection already existing but on a fresh SessionHandle struct so we must
    make sure we have a good 'struct POP3' to play with. For new connections,
    the struct POP3 is allocated and setup in the pop3_connect() function.
  */
  Curl_reset_reqproto(conn);
  retcode = pop3_init(conn);
  if(retcode)
    return retcode;

  /* Parse the URL path */
  retcode = pop3_parse_url_path(conn);
  if(retcode)
    return retcode;

  /* Parse the custom request */
  retcode = pop3_parse_custom_request(conn);
  if(retcode)
    return retcode;

  retcode = pop3_regular_transfer(conn, done);

  return retcode;
}